

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O1

void __thiscall
passthrough_resampler<float>::drop_audio_if_needed(passthrough_resampler<float> *this)

{
  size_t *psVar1;
  ulong uVar2;
  float *__dest;
  uint uVar3;
  uint uVar4;
  ulong uVar6;
  uint uVar5;
  
  uVar2 = (this->internal_input_buffer).length_;
  uVar6 = (ulong)(this->super_processor).channels;
  uVar3 = this->sample_rate / 0x14;
  uVar5 = (uint)(uVar2 / uVar6);
  uVar4 = uVar5 - uVar3;
  if (uVar3 <= uVar5 && uVar4 != 0) {
    uVar6 = uVar4 * uVar6;
    if (uVar6 <= uVar2) {
      __dest = (this->internal_input_buffer).data_;
      memmove(__dest,__dest + uVar6,(uVar2 - uVar6) * 4);
      psVar1 = &(this->internal_input_buffer).length_;
      *psVar1 = *psVar1 - uVar6;
    }
  }
  return;
}

Assistant:

void drop_audio_if_needed()
  {
    uint32_t to_keep = min_buffered_audio_frame(sample_rate);
    uint32_t available = samples_to_frames(internal_input_buffer.length());
    if (available > to_keep) {
      internal_input_buffer.pop(nullptr,
                                frames_to_samples(available - to_keep));
    }
  }